

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

string * __thiscall
pybind11::detail::replace_newlines_and_squash_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *text)

{
  bool bVar1;
  void *pvVar2;
  long lVar3;
  detail dVar4;
  detail *pdVar5;
  string result;
  allocator<char> local_59;
  _Alloc_hider local_58;
  ulong local_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  string *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)this,&local_59);
  if (((local_50 < 2) || (*local_58._M_p != '\'')) || (local_58._M_p[local_50 - 1] != '\'')) {
    local_50 = 0;
    *local_58._M_p = '\0';
    dVar4 = *this;
    local_38 = __return_storage_ptr__;
    if (dVar4 != (detail)0x0) {
      pdVar5 = this + 1;
      bVar1 = false;
      do {
        pvVar2 = memchr(" \t\n\r\f\v",(int)(char)dVar4,7);
        if (!(bool)(pvVar2 != (void *)0x0 & bVar1)) {
          std::__cxx11::string::push_back((char)&local_58);
        }
        dVar4 = *pdVar5;
        pdVar5 = pdVar5 + 1;
        bVar1 = pvVar2 != (void *)0x0;
      } while (dVar4 != (detail)0x0);
    }
    lVar3 = std::__cxx11::string::find_first_not_of((char *)&local_58,0x14ad66,0);
    __return_storage_ptr__ = local_38;
    if (lVar3 == -1) {
      (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"");
    }
    else {
      std::__cxx11::string::find_last_not_of((char *)&local_58,0x14ad66,0xffffffffffffffff);
      __return_storage_ptr__ = local_38;
      std::__cxx11::string::substr((ulong)local_38,(ulong)&local_58);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_58._M_p == &local_48) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_47,local_48);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_40;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_58._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_47,local_48);
    }
    __return_storage_ptr__->_M_string_length = local_50;
    local_50 = 0;
    local_48 = '\0';
    local_58._M_p = &local_48;
  }
  if (local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,CONCAT71(uStack_47,local_48) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string replace_newlines_and_squash(const char *text) {
    const char *whitespaces = " \t\n\r\f\v";
    std::string result(text);
    bool previous_is_whitespace = false;

    if (result.size() >= 2) {
        // Do not modify string representations
        char first_char = result[0];
        char last_char = result[result.size() - 1];
        if (first_char == last_char && first_char == '\'') {
            return result;
        }
    }
    result.clear();

    // Replace characters in whitespaces array with spaces and squash consecutive spaces
    while (*text != '\0') {
        if (std::strchr(whitespaces, *text)) {
            if (!previous_is_whitespace) {
                result += ' ';
                previous_is_whitespace = true;
            }
        } else {
            result += *text;
            previous_is_whitespace = false;
        }
        ++text;
    }

    // Strip leading and trailing whitespaces
    const size_t str_begin = result.find_first_not_of(whitespaces);
    if (str_begin == std::string::npos) {
        return "";
    }

    const size_t str_end = result.find_last_not_of(whitespaces);
    const size_t str_range = str_end - str_begin + 1;

    return result.substr(str_begin, str_range);
}